

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O0

void __thiscall VideoEngine::Canvas::Canvas(Canvas *this,int w,int h)

{
  bool bVar1;
  undefined8 uVar2;
  Program *pPVar3;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  GLuint depth_renderbuffer;
  int h_local;
  int w_local;
  Canvas *this_local;
  
  Program::Program(&this->program_);
  Texture::Texture(&this->color_);
  Framebuffer::Framebuffer(&this->fb_);
  Texture::alloc(&this->color_,w,h,RGBA8);
  glBindFramebuffer(0x8d40,(this->fb_).name);
  GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, fb_.name)");
  glGenRenderbuffers(1,&p.has_value_);
  GLCHECK("glGenRenderbuffers(1, &depth_renderbuffer)");
  glBindRenderbuffer(0x8d41,p._32_4_);
  GLCHECK("glBindRenderbuffer(GL_RENDERBUFFER, depth_renderbuffer)");
  glRenderbufferStorage(0x8d41,0x1902,w,h);
  GLCHECK("glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT, w, h)");
  glBindRenderbuffer(0x8d41,0);
  GLCHECK("glBindRenderbuffer(GL_RENDERBUFFER, 0)");
  glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,p._32_4_);
  GLCHECK(
         "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depth_renderbuffer)"
         );
  Framebuffer::attachColorTexture(&this->fb_,0,&this->color_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "#version 130\nuniform sampler2D frame;\nuniform vec2 R;\nvoid main() {\nvec2 ts = vec2(textureSize(frame, 0));\nvec2 k = ts / R;\nfloat scale = max(k.x, k.y);\nvec2 off = (R-ts/scale)/2. * vec2(step(k.x, k.y), step(k.y, k.x));\nvec2 tc = scale * (gl_FragCoord.xy - off);\ngl_FragColor = vec4(0.);\nif (tc.x >= 0. && tc.x < ts.x && tc.y >= 0. && tc.y < ts.y)\ngl_FragColor = texture2D(frame, tc / (ts + vec2(1.)));\n}\n"
             ,&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"void main() { gl_Position = gl_Vertex; }",&local_99);
  Program::create((Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_50,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_50);
  if (!bVar1) {
    Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::error((Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_50);
    uVar2 = std::__cxx11::string::c_str();
    aAppDebugPrintf("[CRASH] Cannot create canvas program: %s",uVar2);
    aAppTerminate(-1);
  }
  pPVar3 = Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value((Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_50);
  Program::operator=(&this->program_,pPVar3);
  Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_50);
  return;
}

Assistant:

Canvas(int w, int h) {
		color_.alloc(w, h, RGBA8);
		GL(glBindFramebuffer(GL_FRAMEBUFFER, fb_.name));

		GLuint depth_renderbuffer;
		GL(glGenRenderbuffers(1, &depth_renderbuffer));
		GL(glBindRenderbuffer(GL_RENDERBUFFER, depth_renderbuffer));
		GL(glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT, w, h));
		GL(glBindRenderbuffer(GL_RENDERBUFFER, 0));
		GL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depth_renderbuffer));
		//GL(glDeleteRenderbuffers(1, &depth_renderbuffer));

		fb_.attachColorTexture(0, color_);

		auto p = Program::create(
			"#version 130\n"
			"uniform sampler2D frame;\n"
			"uniform vec2 R;\n"
			"void main() {\n"
				"vec2 ts = vec2(textureSize(frame, 0));\n"
				"vec2 k = ts / R;\n"
				"float scale = max(k.x, k.y);\n"
				"vec2 off = (R-ts/scale)/2. * vec2(step(k.x, k.y), step(k.y, k.x));\n"
				"vec2 tc = scale * (gl_FragCoord.xy - off);\n"
				"gl_FragColor = vec4(0.);\n"
				"if (tc.x >= 0. && tc.x < ts.x && tc.y >= 0. && tc.y < ts.y)\n"
					"gl_FragColor = texture2D(frame, tc / (ts + vec2(1.)));\n"
			"}\n",
			"void main() { gl_Position = gl_Vertex; }");

		if (!p)
			CRASH("Cannot create canvas program: %s", p.error().c_str());

		program_ = std::move(p).value();
	}